

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::GetCurrentFunction(JavascriptStackWalker *this,bool includeInlinedFrames)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void **ppvVar4;
  bool includeInlinedFrames_local;
  JavascriptStackWalker *this_local;
  
  bVar2 = IsJavascriptFrame(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x40b,"(this->IsJavascriptFrame())","this->IsJavascriptFrame()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((includeInlinedFrames) && ((*(ushort *)&this->field_0x50 & 1) != 0)) {
    this_local = (JavascriptStackWalker *)
                 InlinedFrameWalker::GetFunctionObject(&this->inlinedFrameWalker);
  }
  else if ((*(ushort *)&this->field_0x50 >> 3 & 1) == 0) {
    ppvVar4 = GetCurrentArgv(this);
    this_local = (JavascriptStackWalker *)
                 StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)*ppvVar4);
  }
  else {
    this_local = (JavascriptStackWalker *)
                 VarTo<Js::JavascriptFunction,Js::RecyclableObject>
                           (this->prevNativeLibraryEntry->function);
  }
  return (JavascriptFunction *)this_local;
}

Assistant:

JavascriptFunction * JavascriptStackWalker::GetCurrentFunction(bool includeInlinedFrames /* = true */) const
    {
        Assert(this->IsJavascriptFrame());

#if ENABLE_NATIVE_CODEGEN
        if (includeInlinedFrames && inlinedFramesBeingWalked)
        {
            return inlinedFrameWalker.GetFunctionObject();
        }
        else
#endif
            if (this->isNativeLibraryFrame)
        {
            // Return saved function. Do not read from stack as compiler may stackpack/optimize args.
            return VarTo<JavascriptFunction>(this->prevNativeLibraryEntry->function);
        }
        else
        {
            return StackScriptFunction::GetCurrentFunctionObject((JavascriptFunction *)this->GetCurrentArgv()[JavascriptFunctionArgIndex_Function]);
        }
    }